

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::Temp::clear(Temp *this)

{
  pointer pnVar1;
  
  if (this->s_mark != (int *)0x0) {
    free(this->s_mark);
    this->s_mark = (int *)0x0;
  }
  if (this->s_cact != (int *)0x0) {
    free(this->s_cact);
    this->s_cact = (int *)0x0;
  }
  pnVar1 = (this->s_max).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar1 != (this->s_max).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (this->s_max).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar1;
  }
  if (this->pivot_col != (Pring *)0x0) {
    free(this->pivot_col);
    this->pivot_col = (Pring *)0x0;
  }
  if (this->pivot_colNZ != (Pring *)0x0) {
    free(this->pivot_colNZ);
    this->pivot_colNZ = (Pring *)0x0;
  }
  if (this->pivot_row != (Pring *)0x0) {
    free(this->pivot_row);
    this->pivot_row = (Pring *)0x0;
  }
  if (this->pivot_rowNZ != (Pring *)0x0) {
    free(this->pivot_rowNZ);
    this->pivot_rowNZ = (Pring *)0x0;
  }
  return;
}

Assistant:

void CLUFactor<R>::Temp::clear()
{
   if(s_mark != nullptr)
      spx_free(s_mark);

   if(s_cact != nullptr)
      spx_free(s_cact);

   if(!s_max.empty())
      s_max.clear();

   if(pivot_col != nullptr)
      spx_free(pivot_col);

   if(pivot_colNZ != nullptr)
      spx_free(pivot_colNZ);

   if(pivot_row != nullptr)
      spx_free(pivot_row);

   if(pivot_rowNZ != nullptr)
      spx_free(pivot_rowNZ);
}